

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O1

int matchshreg(match *res,reg *reg,expr *expr,int shl,disctx *ctx)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  char cVar4;
  ulong uVar5;
  
  lVar2 = 0;
  while( true ) {
    while ((expr->type == EXPR_SHL && (expr->expr2->type == EXPR_NUM))) {
      lVar2 = lVar2 + expr->expr2->num1;
      expr = expr->expr1;
    }
    if (expr->type != EXPR_MUL) break;
    if (expr->expr2->type == EXPR_NUM) {
      uVar5 = expr->expr2->num1;
      uVar3 = uVar5 - (uVar5 >> 1 & 0x5555555555555555);
      uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
      uVar3 = ((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
      cVar4 = (char)(uVar3 >> 0x38);
      if (uVar3 >> 0x38 == 1) {
        for (; uVar5 != 1; uVar5 = uVar5 >> 1) {
          lVar2 = lVar2 + 1;
        }
        expr = expr->expr1;
      }
    }
    else {
      if (expr->expr1->type != EXPR_NUM) break;
      uVar5 = expr->expr1->num1;
      uVar3 = uVar5 - (uVar5 >> 1 & 0x5555555555555555);
      uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
      uVar3 = ((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
      cVar4 = (char)(uVar3 >> 0x38);
      if (uVar3 >> 0x38 == 1) {
        for (; uVar5 != 1; uVar5 = uVar5 >> 1) {
          lVar2 = lVar2 + 1;
        }
        expr = expr->expr2;
      }
    }
    if (cVar4 != '\x01') {
      return 0;
    }
  }
  if (lVar2 != shl) {
    return 0;
  }
  iVar1 = matchreg(res,reg,expr,ctx);
  return iVar1;
}

Assistant:

int matchshreg (struct match *res, const struct reg *reg, const struct expr *expr, int shl, struct disctx *ctx) {
	ull sh = 0;
	while (1) {
		if (expr->type == EXPR_SHL && expr->expr2->type == EXPR_NUM) {
			sh += expr->expr2->num1;
			expr = expr->expr1;
		} else if (expr->type == EXPR_MUL && expr->expr2->type == EXPR_NUM) {
			ull num = expr->expr2->num1;
			if (!num || (num & (num-1)))
				return 0;
			while (num != 1)
				num >>= 1, sh++;
			expr = expr->expr1;
		} else if (expr->type == EXPR_MUL && expr->expr1->type == EXPR_NUM) {
			ull num = expr->expr1->num1;
			if (!num || (num & (num-1)))
				return 0;
			while (num != 1)
				num >>= 1, sh++;
			expr = expr->expr2;
		} else {
			break;
		}
	}
	if (sh != shl)
		return 0;
	return matchreg(res, reg, expr, ctx);
}